

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeBBShaft::MultiplyTandAdd
          (ChConstraintThreeBBShaft *this,ChVectorDynamic<double> *result,double l)

{
  undefined1 auVar1 [16];
  ChVariables *pCVar2;
  Scalar *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double l_local;
  double local_90;
  double local_88;
  ChRowVectorN<double,_6> *local_80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_78;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_58 [56];
  
  l_local = l;
  if (((this->super_ChConstraintThree).variables_a)->disabled == false) {
    local_80 = &this->Cq_a;
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>::operator*
              (&local_78,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>> *)&local_80,
               &l_local);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,result,
               (long)((this->super_ChConstraintThree).variables_a)->offset,6);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                         *)&local_78);
  }
  if (((this->super_ChConstraintThree).variables_b)->disabled == false) {
    local_80 = &this->Cq_b;
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>::operator*
              (&local_78,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>> *)&local_80,
               &l_local);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,result,
               (long)((this->super_ChConstraintThree).variables_b)->offset,6);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                         *)&local_78);
  }
  pCVar2 = (this->super_ChConstraintThree).variables_c;
  if (pCVar2->disabled == false) {
    local_88 = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.
               m_data.array[0];
    local_90 = l_local;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)result,
                        (long)pCVar2->offset);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_88;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_90;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *pSVar3;
    auVar1 = vfmadd213sd_fma(auVar5,auVar4,auVar1);
    *pSVar3 = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::MultiplyTandAdd(ChVectorDynamic<double>& result, double l) {
    if (variables_a->IsActive()) {
        result.segment(variables_a->GetOffset(), 6) += Cq_a.transpose() * l;
    }

    if (variables_b->IsActive()) {
        result.segment(variables_b->GetOffset(), 6) += Cq_b.transpose() * l;
    }

    if (variables_c->IsActive()) {
        result(variables_c->GetOffset()) += Cq_c(0) * l;
    }
}